

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O2

void __thiscall duckdb::Node::InitMerge(Node *this,ART *art,unsafe_vector<idx_t> *upper_bounds)

{
  stack<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,_duckdb::Node>::NodeEntry,_std::deque<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,_duckdb::Node>::NodeEntry,_std::allocator<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,_duckdb::Node>::NodeEntry>_>_>
  *this_00;
  Node ptr;
  NType NVar1;
  NType type;
  byte bVar2;
  _Elt_pointer pNVar3;
  Node256 *pNVar4;
  Node16 *pNVar5;
  Node48 *pNVar6;
  Node *pNVar7;
  InternalException *pIVar8;
  Node *pNVar9;
  uint8_t i;
  long lVar10;
  ulong uVar11;
  allocator local_c9;
  Prefix prefix;
  string local_a8;
  ARTScanner<(duckdb::ARTScanHandling)1,_duckdb::Node> scanner;
  
  this_00 = &scanner.s;
  scanner.art = art;
  ::std::
  stack<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,duckdb::Node>::NodeEntry,std::deque<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,duckdb::Node>::NodeEntry,std::allocator<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,duckdb::Node>::NodeEntry>>>
  ::
  stack<std::deque<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,duckdb::Node>::NodeEntry,std::allocator<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,duckdb::Node>::NodeEntry>>,void>
            (this_00);
  ::std::
  deque<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,duckdb::Node>::NodeEntry,std::allocator<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,duckdb::Node>::NodeEntry>>
  ::emplace_back<duckdb::Node&>
            ((deque<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,duckdb::Node>::NodeEntry,std::allocator<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,duckdb::Node>::NodeEntry>>
              *)this_00,this);
switchD_01a179c6_caseD_2:
  do {
    if (scanner.s.c.
        super__Deque_base<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,_duckdb::Node>::NodeEntry,_std::allocator<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,_duckdb::Node>::NodeEntry>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        scanner.s.c.
        super__Deque_base<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,_duckdb::Node>::NodeEntry,_std::allocator<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,_duckdb::Node>::NodeEntry>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur) {
      ::std::
      _Deque_base<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,_duckdb::Node>::NodeEntry,_std::allocator<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,_duckdb::Node>::NodeEntry>_>
      ::~_Deque_base((_Deque_base<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,_duckdb::Node>::NodeEntry,_std::allocator<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,_duckdb::Node>::NodeEntry>_>
                      *)this_00);
      return;
    }
    pNVar3 = scanner.s.c.
             super__Deque_base<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,_duckdb::Node>::NodeEntry,_std::allocator<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,_duckdb::Node>::NodeEntry>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (scanner.s.c.
        super__Deque_base<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,_duckdb::Node>::NodeEntry,_std::allocator<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,_duckdb::Node>::NodeEntry>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        scanner.s.c.
        super__Deque_base<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,_duckdb::Node>::NodeEntry,_std::allocator<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,_duckdb::Node>::NodeEntry>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      pNVar3 = scanner.s.c.
               super__Deque_base<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,_duckdb::Node>::NodeEntry,_std::allocator<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,_duckdb::Node>::NodeEntry>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
    }
    if (pNVar3[-1].exhausted != true) {
      pNVar3[-1].exhausted = true;
      ptr.super_IndexPointer.data = (IndexPointer)((pNVar3[-1].node)->super_IndexPointer).data;
      switch(ptr.super_IndexPointer.data._7_1_ & 0x7f) {
      case PREFIX:
        Prefix::Prefix(&prefix,scanner.art,ptr,true,false);
        ::std::
        deque<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,duckdb::Node>::NodeEntry,std::allocator<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,duckdb::Node>::NodeEntry>>
        ::emplace_back<duckdb::Node&>
                  ((deque<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,duckdb::Node>::NodeEntry,std::allocator<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,duckdb::Node>::NodeEntry>>
                    *)this_00,prefix.ptr);
        break;
      case LEAF:
      case LEAF_INLINED:
      case NODE_7_LEAF:
      case NODE_15_LEAF:
      case NODE_256_LEAF:
        break;
      case NODE_4:
        pNVar7 = (Node *)Ref<duckdb::Node4>(scanner.art,ptr,NODE_4);
        pNVar9 = pNVar7;
        for (uVar11 = 0; pNVar9 = pNVar9 + 1, uVar11 < (byte)(pNVar7->super_IndexPointer).data;
            uVar11 = uVar11 + 1) {
          ::std::
          deque<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,duckdb::Node>::NodeEntry,std::allocator<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,duckdb::Node>::NodeEntry>>
          ::emplace_back<duckdb::Node&>
                    ((deque<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,duckdb::Node>::NodeEntry,std::allocator<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,duckdb::Node>::NodeEntry>>
                      *)this_00,pNVar9);
        }
        break;
      case NODE_16:
        pNVar5 = Ref<duckdb::Node16>(scanner.art,ptr,NODE_16);
        pNVar9 = (pNVar5->super_BaseNode<(unsigned_char)__x10_,_(duckdb::NType)4>).children;
        for (uVar11 = 0;
            uVar11 < (pNVar5->super_BaseNode<(unsigned_char)__x10_,_(duckdb::NType)4>).count;
            uVar11 = uVar11 + 1) {
          ::std::
          deque<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,duckdb::Node>::NodeEntry,std::allocator<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,duckdb::Node>::NodeEntry>>
          ::emplace_back<duckdb::Node&>
                    ((deque<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,duckdb::Node>::NodeEntry,std::allocator<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,duckdb::Node>::NodeEntry>>
                      *)this_00,pNVar9);
          pNVar9 = pNVar9 + 1;
        }
        break;
      case NODE_48:
        pNVar6 = Ref<duckdb::Node48>(scanner.art,ptr,NODE_48);
        for (lVar10 = 0; lVar10 != 0x100; lVar10 = lVar10 + 1) {
          if ((ulong)pNVar6->child_index[lVar10] != 0x30) {
            ::std::
            deque<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,duckdb::Node>::NodeEntry,std::allocator<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,duckdb::Node>::NodeEntry>>
            ::emplace_back<duckdb::Node&>
                      ((deque<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,duckdb::Node>::NodeEntry,std::allocator<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,duckdb::Node>::NodeEntry>>
                        *)this_00,pNVar6->children + pNVar6->child_index[lVar10]);
          }
        }
        break;
      case NODE_256:
        pNVar4 = Ref<duckdb::Node256>(scanner.art,ptr,NODE_256);
        for (lVar10 = 0; lVar10 != 0x800; lVar10 = lVar10 + 8) {
          if (*(char *)((long)&pNVar4->children[0].super_IndexPointer.data + lVar10 + 7) != '\0') {
            ::std::
            deque<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,duckdb::Node>::NodeEntry,std::allocator<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,duckdb::Node>::NodeEntry>>
            ::emplace_back<duckdb::Node&>
                      ((deque<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,duckdb::Node>::NodeEntry,std::allocator<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,duckdb::Node>::NodeEntry>>
                        *)this_00,
                       (Node *)((long)&pNVar4->children[0].super_IndexPointer.data + lVar10));
          }
        }
        break;
      default:
        pIVar8 = (InternalException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&prefix,"invalid node type for ART ScanHandleLast: %s",&local_c9);
        EnumUtil::ToString<duckdb::NType>(&local_a8,ptr.super_IndexPointer.data._7_1_ & 0x7f);
        InternalException::InternalException<std::__cxx11::string>
                  (pIVar8,(string *)&prefix,&local_a8);
        __cxa_throw(pIVar8,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      goto switchD_01a179c6_caseD_2;
    }
    pNVar9 = pNVar3[-1].node;
    NVar1 = (NType)((pNVar9->super_IndexPointer).data >> 0x38);
    type = NVar1 & 0x7f;
    if (type != LEAF_INLINED) {
      if ((NVar1 & 0x7f) == LEAF) {
        pIVar8 = (InternalException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&prefix,"deprecated ART storage in InitMerge",(allocator *)&local_a8);
        InternalException::InternalException(pIVar8,(string *)&prefix);
        __cxa_throw(pIVar8,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      bVar2 = GetAllocatorIdx(type);
      (pNVar9->super_IndexPointer).data =
           (pNVar9->super_IndexPointer).data +
           (upper_bounds->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start[bVar2];
    }
    ::std::
    deque<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,_duckdb::Node>::NodeEntry,_std::allocator<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,_duckdb::Node>::NodeEntry>_>
    ::pop_back(&this_00->c);
  } while( true );
}

Assistant:

void Node::InitMerge(ART &art, const unsafe_vector<idx_t> &upper_bounds) {
	D_ASSERT(HasMetadata());
	ARTScanner<ARTScanHandling::POP, Node> scanner(art);

	auto handler = [&upper_bounds](Node &node) {
		const auto type = node.GetType();
		if (node.GetType() == NType::LEAF_INLINED) {
			return ARTScanHandlingResult::CONTINUE;
		}
		if (type == NType::LEAF) {
			throw InternalException("deprecated ART storage in InitMerge");
		}
		const auto idx = GetAllocatorIdx(type);
		node.IncreaseBufferId(upper_bounds[idx]);
		return ARTScanHandlingResult::CONTINUE;
	};

	scanner.Init(handler, *this);
	scanner.Scan(handler);
}